

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second,
              ExprBase *third)

{
  Lexeme *allocator;
  TypeBase *type;
  ExprBase *source_00;
  ExprSequence *this;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase*> local_80 [32];
  undefined1 local_60 [8];
  SmallArray<ExprBase_*,_3U> expressions;
  ExprBase *third_local;
  ExprBase *second_local;
  ExprBase *first_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  expressions.allocator = (Allocator *)third;
  third_local = second;
  second_local = first;
  first_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  SmallArray<ExprBase_*,_3U>::SmallArray((SmallArray<ExprBase_*,_3U> *)local_60,ctx->allocator);
  SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_60,&second_local);
  SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_60,&third_local);
  SmallArray<ExprBase_*,_3U>::push_back
            ((SmallArray<ExprBase_*,_3U> *)local_60,(ExprBase **)&expressions.allocator);
  this = ExpressionContext::get<ExprSequence>((ExpressionContext *)source_local);
  source_00 = first_local;
  allocator = source_local[0x229].begin;
  type = (TypeBase *)expressions.allocator[3]._vptr_Allocator;
  ArrayView<ExprBase*>::ArrayView<3u>(local_80,(SmallArray<ExprBase_*,_3U> *)local_60);
  arr._12_4_ = 0;
  arr._0_12_ = local_80._0_12_;
  ExprSequence::ExprSequence(this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
  SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_60);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second, ExprBase *third)
{
	SmallArray<ExprBase*, 3> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);
	expressions.push_back(third);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, third->type, expressions);
}